

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_LU_invmult(m2v *LU,int rank,int *rowperm,int *colperm,m2v *Y,m2v *X_out)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  long lVar5;
  ulong uVar6;
  
  if (rank == -1) {
    rank = LU->n_row;
    if (LU->n_col < LU->n_row) {
      rank = LU->n_col;
    }
  }
  for (lVar5 = (long)rank; lVar5 < X_out->n_row; lVar5 = lVar5 + 1) {
    m2v_clear_row(X_out,colperm[lVar5]);
  }
  uVar4 = 0;
  uVar3 = 0;
  if (0 < rank) {
    uVar3 = (ulong)(uint)rank;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    m2v_copy_row(Y,rowperm[uVar4],X_out,colperm[uVar4]);
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = colperm[uVar6];
      iVar2 = m2v_get_el(LU,(int)uVar4,(int)uVar6);
      m2v_multadd_row(X_out,iVar1,iVar2,X_out,colperm[uVar4]);
    }
  }
  uVar3 = (ulong)(uint)rank;
  while (0 < (int)uVar3) {
    uVar4 = uVar3 - 1;
    for (uVar6 = uVar3; uVar3 = uVar4, (int)uVar6 < LU->n_col; uVar6 = uVar6 + 1) {
      iVar1 = colperm[uVar6];
      iVar2 = m2v_get_el(LU,(int)uVar4,(int)uVar6);
      m2v_multadd_row(X_out,iVar1,iVar2,X_out,colperm[uVar4 & 0xffffffff]);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult)(const MV_GEN_TYPE* LU,
			int rank,
			const int* rowperm,
			const int* colperm,
			const MV_GEN_TYPE* Y,
			MV_GEN_TYPE* X_out)
{
	/* Check dimensions */
	assert(LU->n_col == X_out->n_row);
	assert(LU->n_row == Y->n_row);
	assert(X_out->n_col == Y->n_col);

	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Clear out the unused rows in the target vector */
	for (int i = rank; i < X_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(X_out, colperm[i]);
	}

	/* Multiply with L^-1 */
	for (int i = 0; i < rank; ++i) {
		MV_GEN_N(_copy_row)(Y, rowperm[i], X_out, colperm[i]);
		for (int j = 0; j < i; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
					MV_GEN_N(_get_el)(LU, i, j),
					X_out, colperm[i]);
		}
	}

	/* Multiply with U^-1 */
	for (int i = rank - 1; i >= 0; --i) {
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
			  MV_GEN_N(_get_el)(LU, i, j), X_out, colperm[i]);
		}
		MV_GEN_N(_mult_row)(X_out, colperm[i],
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}